

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_type.hpp
# Opt level: O0

void __thiscall
ExchCXX::detail::BuiltinKernelImpl<ExchCXX::BuiltinB88,void>::
eval_exc_vxc_<int&,double_const*&,double_const*&,double*&,double*&,double*&>
          (BuiltinKernelImpl<ExchCXX::BuiltinB88,_void> *this,int *args,double **args_1,
          double **args_2,double **args_3,double **args_4,double **args_5)

{
  bool bVar1;
  const_host_buffer_type in_RCX;
  const_host_buffer_type in_RDX;
  host_buffer_type in_RSI;
  BuiltinKernel *in_RDI;
  host_buffer_type in_R8;
  host_buffer_type in_R9;
  const_host_buffer_type unaff_retaddr;
  host_buffer_type in_stack_ffffffffffffffc8;
  
  bVar1 = BuiltinKernel::is_polarized(in_RDI);
  if (bVar1) {
    host_eval_exc_vxc_helper_polar<ExchCXX::BuiltinB88>
              (args_3._4_4_,(const_host_buffer_type)args_4,unaff_retaddr,(host_buffer_type)in_RDI,
               in_RSI,in_RDX);
  }
  else {
    host_eval_exc_vxc_helper_unpolar<ExchCXX::BuiltinB88>
              ((int)((ulong)in_RSI >> 0x20),in_RDX,in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void eval_exc_vxc_(Args&&... args) const {
    if( is_polarized() )
      host_eval_exc_vxc_helper_polar<KernelType>(
        std::forward<Args>(args)...
      );
    else
      host_eval_exc_vxc_helper_unpolar<KernelType>(
        std::forward<Args>(args)...
      );
  }